

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O0

void __thiscall
ApiLayerManifestFile::PopulateApiLayerProperties
          (ApiLayerManifestFile *this,XrApiLayerProperties *props)

{
  char *pcVar1;
  ulong uVar2;
  XrApiLayerProperties *props_local;
  ApiLayerManifestFile *this_local;
  
  props->layerVersion = this->_implementation_version;
  props->specVersion =
       (ulong)(this->_api_version).major << 0x30 |
       ((ulong)(this->_api_version).minor & 0xffff) << 0x20 | (ulong)(this->_api_version).patch;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  strncpy(props->layerName,pcVar1,0xff);
  uVar2 = std::__cxx11::string::size();
  if (0xfe < uVar2) {
    props->layerName[0xff] = '\0';
  }
  pcVar1 = (char *)std::__cxx11::string::c_str();
  strncpy(props->description,pcVar1,0xff);
  uVar2 = std::__cxx11::string::size();
  if (0xfe < uVar2) {
    props->description[0xff] = '\0';
  }
  return;
}

Assistant:

void ApiLayerManifestFile::PopulateApiLayerProperties(XrApiLayerProperties &props) const {
    props.layerVersion = _implementation_version;
    props.specVersion = XR_MAKE_VERSION(_api_version.major, _api_version.minor, _api_version.patch);
    strncpy(props.layerName, _layer_name.c_str(), XR_MAX_API_LAYER_NAME_SIZE - 1);
    if (_layer_name.size() >= XR_MAX_API_LAYER_NAME_SIZE - 1) {
        props.layerName[XR_MAX_API_LAYER_NAME_SIZE - 1] = '\0';
    }
    strncpy(props.description, _description.c_str(), XR_MAX_API_LAYER_DESCRIPTION_SIZE - 1);
    if (_description.size() >= XR_MAX_API_LAYER_DESCRIPTION_SIZE - 1) {
        props.description[XR_MAX_API_LAYER_DESCRIPTION_SIZE - 1] = '\0';
    }
}